

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_database_window.cpp
# Opt level: O3

void ModelDbWindow::render(registry *p_reg)

{
  key_type *pkVar1;
  bool bVar2;
  size_t sVar3;
  ostream *poVar4;
  iterator iVar5;
  undefined8 uVar6;
  key_type *__k;
  long *plVar7;
  ostringstream modeldata_ostr;
  stringstream ostr_texture_size;
  stringstream ostr_texture_type;
  stringstream ostr_texture_path;
  stringstream ostr_texture_gl_id;
  stringstream m_vertices_ostr;
  stringstream m_indices_ostr;
  ImVec2 local_b30;
  ImVec2 local_b28;
  ImVec2 local_b20;
  long *local_b18;
  undefined8 uStack_b10;
  long local_b08 [2];
  ImVec4 local_af8;
  undefined1 local_ae8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ad8 [6];
  ios_base local_a78 [16];
  ios_base aiStack_a68 [264];
  long *local_960 [2];
  long local_950 [14];
  ios_base aiStack_8e0 [264];
  long *local_7d8 [2];
  long local_7c8 [14];
  ios_base local_758 [264];
  long *local_650 [2];
  long local_640 [14];
  ios_base local_5d0 [264];
  long *local_4c8 [2];
  long local_4b8 [14];
  ios_base aiStack_448 [264];
  long *local_340 [2];
  long local_330 [14];
  ios_base aiStack_2c0 [264];
  long *local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  ImGui::Begin("Model Database",(bool *)0x0,0);
  bVar2 = ImGui::CollapsingHeader("Load Models",0);
  if (bVar2) {
    ImGui::InputText("path:",render::model_path_text,0x40,0,(ImGuiInputTextCallback)0x0,(void *)0x0)
    ;
    local_ae8._0_4_ = 0.0;
    local_ae8._4_4_ = 0.0;
    bVar2 = ImGui::Button("Load Model",(ImVec2 *)local_ae8);
    if (bVar2) {
      local_ae8._0_8_ = (long)local_ae8 + 0x10;
      sVar3 = strlen(render::model_path_text);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_ae8,render::model_path_text,render::model_path_text + sVar3);
      ModelDb::add_model_job((string *)local_ae8);
      if (local_ae8._0_8_ != (long)local_ae8 + 0x10) {
        operator_delete((void *)local_ae8._0_8_,local_ad8[0]._M_allocated_capacity + 1);
      }
    }
  }
  bVar2 = ImGui::CollapsingHeader("Models List",0);
  if ((bVar2) && (ModelDb::map._16_8_ != 0)) {
    plVar7 = (long *)ModelDb::map._16_8_;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ae8);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_ae8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_ae8,(char *)plVar7[2],plVar7[3]);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ae8);
      std::ios_base::~ios_base(local_a78);
      plVar7 = (long *)*plVar7;
    } while (plVar7 != (long *)0x0);
  }
  bVar2 = ImGui::CollapsingHeader("Meshes List",0);
  if ((bVar2) && (MeshDb::map._16_8_ != 0)) {
    plVar7 = (long *)MeshDb::map._16_8_;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_ae8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_ae8 + 0x10),"m_vao_id: ",10);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_ae8 + 0x10));
      std::__cxx11::stringbuf::str();
      bVar2 = ImGui::TreeNode((char *)local_340[0]);
      if (local_340[0] != local_330) {
        operator_delete(local_340[0],local_330[0] + 1);
      }
      if (bVar2) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_340);
        std::ostream::_M_insert<unsigned_long>((ulong)local_330);
        std::__cxx11::stringbuf::str();
        ImGui::Text("vertices count: %s",local_1b8[0]);
        if (local_1b8[0] != local_1a8) {
          operator_delete(local_1b8[0],local_1a8[0] + 1);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        ImGui::Text("indices count: %s",local_4c8[0]);
        if (local_4c8[0] != local_4b8) {
          operator_delete(local_4c8[0],local_4b8[0] + 1);
        }
        bVar2 = ImGui::TreeNode("Textures:");
        if (bVar2) {
          pkVar1 = (key_type *)plVar7[0xb];
          for (__k = (key_type *)plVar7[10]; __k != pkVar1; __k = __k + 2) {
            iVar5 = std::
                    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_TextureInfo>,_std::allocator<std::pair<const_unsigned_int,_TextureInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_TextureInfo>,_std::allocator<std::pair<const_unsigned_int,_TextureInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)TextureDb::map,__k);
            if (iVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_TextureInfo>,_false>.
                _M_cur == (__node_type *)0x0) {
              uVar6 = std::__throw_out_of_range("_Map_base::at");
              __clang_call_terminate(uVar6);
            }
            std::__cxx11::stringstream::stringstream((stringstream *)local_4c8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
            std::__cxx11::stringbuf::str();
            ImGui::Text("id: %s",local_650[0]);
            if (local_650[0] != local_640) {
              operator_delete(local_650[0],local_640[0] + 1);
            }
            std::__cxx11::stringstream::stringstream((stringstream *)local_650);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_640,
                       *(char **)((long)iVar5.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_TextureInfo>,_false>
                                        ._M_cur + 0x18),
                       *(long *)((long)iVar5.
                                       super__Node_iterator_base<std::pair<const_unsigned_int,_TextureInfo>,_false>
                                       ._M_cur + 0x20));
            std::__cxx11::stringbuf::str();
            ImGui::Text("path: %s",local_7d8[0]);
            if (local_7d8[0] != local_7c8) {
              operator_delete(local_7d8[0],local_7c8[0] + 1);
            }
            std::__cxx11::stringstream::stringstream((stringstream *)local_7d8);
            operator<<((ostream *)local_7c8,
                       *(TextureType *)
                        ((long)iVar5.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_TextureInfo>,_false>
                               ._M_cur + 0x14));
            std::__cxx11::stringbuf::str();
            ImGui::Text("type: %s",local_960[0]);
            if (local_960[0] != local_950) {
              operator_delete(local_960[0],local_950[0] + 1);
            }
            std::__cxx11::stringstream::stringstream((stringstream *)local_960);
            poVar4 = (ostream *)
                     std::ostream::operator<<
                               (local_950,
                                *(int *)((long)iVar5.
                                               super__Node_iterator_base<std::pair<const_unsigned_int,_TextureInfo>,_false>
                                               ._M_cur + 0x38));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            poVar4 = (ostream *)
                     std::ostream::operator<<
                               (poVar4,*(int *)((long)iVar5.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_TextureInfo>,_false>
                                                  ._M_cur + 0x3c));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
            std::ostream::operator<<
                      (poVar4,*(int *)((long)iVar5.
                                             super__Node_iterator_base<std::pair<const_unsigned_int,_TextureInfo>,_false>
                                             ._M_cur + 0x40));
            std::__cxx11::stringbuf::str();
            ImGui::Text("dimension: %s",local_b18);
            if (local_b18 != local_b08) {
              operator_delete(local_b18,local_b08[0] + 1);
            }
            local_b20.y = (float)(int)((ulong)*(undefined8 *)
                                               ((long)iVar5.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_TextureInfo>,_false>
                                                  ._M_cur + 0x38) >> 0x20);
            local_b20.x = (float)(int)*(undefined8 *)
                                       ((long)iVar5.
                                              super__Node_iterator_base<std::pair<const_unsigned_int,_TextureInfo>,_false>
                                              ._M_cur + 0x38);
            local_b28.x = 0.0;
            local_b28.y = 0.0;
            local_b30.x = 1.0;
            local_b30.y = 1.0;
            local_b18 = (long *)0x3f8000003f800000;
            uStack_b10._0_4_ = 1.0;
            uStack_b10._4_4_ = 1.0;
            local_af8.x = 0.0;
            local_af8.y = 0.0;
            local_af8.z = 0.0;
            local_af8.w = 0.0;
            ImGui::Image((ImTextureID)
                         (ulong)*(uint *)((long)iVar5.
                                                super__Node_iterator_base<std::pair<const_unsigned_int,_TextureInfo>,_false>
                                                ._M_cur + 0x10),&local_b20,&local_b28,&local_b30,
                         (ImVec4 *)&local_b18,&local_af8);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_960);
            std::ios_base::~ios_base(aiStack_8e0);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_7d8);
            std::ios_base::~ios_base(local_758);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_650);
            std::ios_base::~ios_base(local_5d0);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_4c8);
            std::ios_base::~ios_base(aiStack_448);
          }
          ImGui::TreePop();
        }
        ImGui::TreePop();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(aiStack_2c0);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_ae8);
      std::ios_base::~ios_base(aiStack_a68);
      plVar7 = (long *)*plVar7;
    } while (plVar7 != (long *)0x0);
  }
  ImGui::End();
  return;
}

Assistant:

void ModelDbWindow::render(
    entt::registry &p_reg) noexcept // We will use this to list users of ModelInfo
{
    ImGui::Begin("Model Database");
    if (ImGui::CollapsingHeader("Load Models"))
    {
        static char model_path_text[64] = "";
        ImGui::InputText("path:", model_path_text, 64);
        if (ImGui::Button("Load Model"))
        {
            ModelDb::add_model_job(
                std::string(model_path_text));
        }
    }
    if (ImGui::CollapsingHeader("Models List"))
    {
        for (const auto &p_modeldata_iter : ModelDb::map)
        {
            std::ostringstream modeldata_ostr;
            modeldata_ostr << p_modeldata_iter.first << " : ";
            modeldata_ostr << p_modeldata_iter.second.m_path;
        };
    }

    if (ImGui::CollapsingHeader("Meshes List"))
    {
        for (const std::pair<const std::size_t, Mesh> &mesh_iter : MeshDb::map)
        {
            const Mesh &mesh = mesh_iter.second;
            std::stringstream vao_id_ostr;
            vao_id_ostr << "m_vao_id: ";
            vao_id_ostr << mesh.m_vao_id;
            if (ImGui::TreeNode(vao_id_ostr.str().c_str()))
            {
                std::stringstream m_vertices_ostr;
                m_vertices_ostr << mesh.m_vertices.size();
                ImGui::Text("vertices count: %s", m_vertices_ostr.str().c_str());
                std::stringstream m_indices_ostr;
                m_indices_ostr << mesh.m_indices.size();
                ImGui::Text("indices count: %s", m_indices_ostr.str().c_str());
                if (ImGui::TreeNode("Textures:"))
                {
                    for (const Texture &p_texture_id : mesh.m_textures)
                    {
                        // TODO :: Refactor a bunch of this
                        const TextureInfo &texture_data = TextureDb::map.at(p_texture_id.m_gl_id);
                        std::stringstream ostr_texture_gl_id;
                        ostr_texture_gl_id << texture_data.m_gl_id;
                        ImGui::Text("id: %s", ostr_texture_gl_id.str().c_str());

                        std::stringstream ostr_texture_path;
                        ostr_texture_path << texture_data.m_path;
                        ImGui::Text("path: %s", ostr_texture_path.str().c_str());

                        std::stringstream ostr_texture_type;
                        ostr_texture_type << texture_data.m_type;
                        ImGui::Text("type: %s", ostr_texture_type.str().c_str());

                        std::stringstream ostr_texture_size;
                        ostr_texture_size << texture_data.m_dimension[0] << " " << texture_data.m_dimension[1] << ", " << texture_data.m_dimension[2];
                        ImGui::Text("dimension: %s", ostr_texture_size.str().c_str());

                        // TODO :: Figure out how to resize the image properly, maintaing its aspect ratio etc etc
                        ImGui::Image(
                            (ImTextureID)(intptr_t)texture_data.m_gl_id,
                            ImVec2(
                                static_cast<float>(texture_data.m_dimension[0]),
                                static_cast<float>(texture_data.m_dimension[1])));
                    };
                    ImGui::TreePop();
                }
                ImGui::TreePop();
            }
        };
    }
    ImGui::End();
}